

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O0

int __thiscall front::symbol::ArraySymbol::getSize(ArraySymbol *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *this_00;
  long in_RDI;
  SharedExNdPtr i;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *__range3;
  int size;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar4;
  shared_ptr<front::express::ExpressNode> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
  local_28;
  long local_20;
  int local_14;
  int local_4;
  
  if (*(int *)(in_RDI + 0x44) < 0) {
    local_14 = 1;
    local_20 = in_RDI + 0x48;
    local_28._M_current =
         (shared_ptr<front::express::ExpressNode> *)
         std::
         vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
         ::begin((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::end((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
      ::operator*(&local_28);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                (in_stack_ffffffffffffff80,
                 (shared_ptr<front::express::ExpressNode> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      peVar3 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2b2eed);
      bVar1 = peVar3->_type != CNS;
      if (bVar1) {
        *(undefined4 *)(in_RDI + 0x44) = 0;
        local_4 = *(int *)(in_RDI + 0x44);
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2b2efc);
        local_14 = peVar3->_value * local_14;
      }
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2b2f3c);
      if (bVar1) {
        return local_4;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
      ::operator++(&local_28);
    }
    iVar4 = local_14;
    std::static_pointer_cast<front::symbol::IntSymbol,front::symbol::Symbol>
              ((shared_ptr<front::symbol::Symbol> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    this_00 = std::
              __shared_ptr_access<front::symbol::IntSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<front::symbol::IntSymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2b2f86);
    iVar2 = IntSymbol::getSize(this_00);
    *(int *)(in_RDI + 0x44) = iVar4 * iVar2;
    std::shared_ptr<front::symbol::IntSymbol>::~shared_ptr
              ((shared_ptr<front::symbol::IntSymbol> *)0x2b2fb1);
    local_4 = *(int *)(in_RDI + 0x44);
  }
  else {
    local_4 = *(int *)(in_RDI + 0x44);
  }
  return local_4;
}

Assistant:

int getSize() {
    if (_size >= 0) {
      return _size;
    } else {
      int size = 1;
      for (SharedExNdPtr i : _dimensions) {
        if (i->_type == front::express::NodeType::CNS) {
          size *= i->_value;
        } else {
          _size = 0;
          return _size;
        }
      }
      _size = size * static_pointer_cast<IntSymbol>(_item)->getSize();
      return _size;
    }
  }